

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall Nova::Driver<float,_2>::Write_Last_Frame(Driver<float,_2> *this,int frame)

{
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,&this->example->output_directory,"/common/last_frame");
  std::__cxx11::to_string(&local_50,frame);
  File_Utilities::Write_To_Text_File<std::__cxx11::string>(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::operator+(&local_30,&this->example->output_directory,"/info.nova-animation");
  std::__cxx11::to_string(&local_50,frame);
  File_Utilities::Write_To_Text_File<std::__cxx11::string>(&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Driver<T,d>::
Write_Last_Frame(const int frame) const
{
    File_Utilities::Write_To_Text_File(example.output_directory+"/common/last_frame",std::to_string(frame));
    File_Utilities::Write_To_Text_File(example.output_directory+"/info.nova-animation",std::to_string(frame));
}